

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_fwd.hpp
# Opt level: O1

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  bool bVar16;
  undefined3 uVar17;
  
  bVar16 = param_1->is_ok_;
  uVar17 = *(undefined3 *)&param_1->field_0x1;
  uVar2 = *(undefined4 *)&param_1->field_0x4;
  sVar10 = param_1->first_line_;
  uVar3 = *(undefined4 *)((long)&param_1->first_line_ + 4);
  sVar11 = param_1->first_column_;
  uVar4 = *(undefined4 *)((long)&param_1->first_column_ + 4);
  sVar12 = param_1->first_offset_;
  uVar5 = *(undefined4 *)((long)&param_1->first_offset_ + 4);
  sVar13 = param_1->last_line_;
  uVar6 = *(undefined4 *)((long)&param_1->last_line_ + 4);
  sVar14 = param_1->last_column_;
  uVar7 = *(undefined4 *)((long)&param_1->last_column_ + 4);
  uVar8 = *(undefined4 *)((long)&param_1->last_offset_ + 4);
  sVar15 = param_1->length_;
  uVar9 = *(undefined4 *)((long)&param_1->length_ + 4);
  *(int *)&this->last_offset_ = (int)param_1->last_offset_;
  *(undefined4 *)((long)&this->last_offset_ + 4) = uVar8;
  *(int *)&this->length_ = (int)sVar15;
  *(undefined4 *)((long)&this->length_ + 4) = uVar9;
  *(int *)&this->last_line_ = (int)sVar13;
  *(undefined4 *)((long)&this->last_line_ + 4) = uVar6;
  *(int *)&this->last_column_ = (int)sVar14;
  *(undefined4 *)((long)&this->last_column_ + 4) = uVar7;
  *(int *)&this->first_column_ = (int)sVar11;
  *(undefined4 *)((long)&this->first_column_ + 4) = uVar4;
  *(int *)&this->first_offset_ = (int)sVar12;
  *(undefined4 *)((long)&this->first_offset_ + 4) = uVar5;
  this->is_ok_ = bVar16;
  *(undefined3 *)&this->field_0x1 = uVar17;
  *(undefined4 *)&this->field_0x4 = uVar2;
  *(int *)&this->first_line_ = (int)sVar10;
  *(undefined4 *)((long)&this->first_line_ + 4) = uVar3;
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  pcVar1 = (param_1->file_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_name_,pcVar1,pcVar1 + (param_1->file_name_)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->line_str_,&param_1->line_str_);
  return;
}

Assistant:

source_location(source_location const&) = default;